

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementI
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,RegSlot indexRegSlot,
          RegSlot regSlot,ProfileId profileId)

{
  JitArenaAllocator *alloc;
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  uint uVar8;
  undefined4 *puVar9;
  JITTimeProfileInfo *pJVar10;
  byte *pbVar11;
  RegOpnd *pRVar12;
  RegOpnd *indexReg;
  IndirOpnd *dstOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar13;
  JitProfilingInstr *this_00;
  JitProfilingInstr *pJVar14;
  ProfiledInstr *pPVar15;
  Func *func;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType arrayType;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x161e,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004985b7;
    *puVar9 = 0;
  }
  ValueType::ValueType((ValueType *)&local_32[0].field_0);
  if (profileId == 0xffff) {
LAB_00498261:
    bVar4 = 0;
    bVar3 = false;
    bVar6 = false;
    local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    local_50 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
  }
  else {
    if ((newOpcode == StElemI_A_Strict) || (newOpcode == StElemI_A)) {
      bVar3 = DoLoadInstructionArrayProfileInfo(this);
      if (!bVar3) goto LAB_00498261;
      pJVar10 = Func::GetReadOnlyProfileInfo(this->m_func);
      local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 JITTimeProfileInfo::GetStElemInfo(pJVar10,profileId);
      local_32[0].field_0 =
           *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)local_48;
      pbVar11 = (byte *)((long)local_48 + 3);
      bVar3 = true;
      bVar6 = false;
      local_50 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    }
    else {
      if ((newOpcode != LdElemI_A) || (bVar3 = DoLoadInstructionArrayProfileInfo(this), !bVar3))
      goto LAB_00498261;
      pJVar10 = Func::GetReadOnlyProfileInfo(this->m_func);
      local_50 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 JITTimeProfileInfo::GetLdElemInfo(pJVar10,profileId);
      local_32[0].field_0 =
           *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)local_50;
      pbVar11 = (byte *)((long)local_50 + 5);
      bVar6 = true;
      bVar3 = false;
      local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    }
    bVar4 = *pbVar11 ^ 1;
  }
  pRVar12 = BuildSrcOpnd(this,baseRegSlot,TyVar);
  indexReg = BuildSrcOpnd(this,indexRegSlot,TyVar);
  dstOpnd = BuildIndirOpnd(this,pRVar12,indexReg);
  if ((bVar6) || (bVar3)) {
    bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if ((bVar5) && (bVar5 = AllowNativeArrayProfileInfo(this), !bVar5)) {
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_32[0].field_0,TypeIds_Array);
      alloc = this->m_func->m_alloc;
      if (bVar6) {
        paVar13 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(6,alloc,0x3d6ef4);
        *(undefined4 *)paVar13 = *(undefined4 *)local_50;
        paVar13[2] = local_50[2];
        paVar13->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_32[0];
        local_50 = paVar13;
      }
      else {
        paVar13 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(4,alloc,0x3d6ef4);
        *(undefined4 *)paVar13 = *(undefined4 *)local_48;
        paVar13->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_32[0];
        local_48 = paVar13;
      }
    }
    IR::Opnd::SetValueType(&dstOpnd->m_baseOpnd->super_Opnd,(ValueType)local_32[0].field_0);
    BVar7 = Func::HasTry(this->m_func->topFunc);
    if (BVar7 != 0) {
      bVar5 = Func::DoOptimizeTry(this->m_func->topFunc);
      if (!bVar5) {
        bVar3 = false;
        bVar6 = false;
      }
    }
  }
  uVar2 = (uint)newOpcode;
  uVar8 = uVar2 - 0x97;
  if (uVar8 < 0xf) {
    if ((0x6005U >> (uVar8 & 0x1f) & 1) != 0) goto LAB_004983f5;
    if ((0x28U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_00498399;
    pRVar12 = BuildSrcOpnd(this,regSlot,TyVar);
    bVar6 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if ((profileId != 0xffff) && (bVar6)) {
      this_00 = IR::JitProfilingInstr::New
                          (newOpcode,&dstOpnd->super_Opnd,&pRVar12->super_Opnd,this->m_func);
      pJVar14 = IR::Instr::AsJitProfilingInstr(&this_00->super_Instr);
      pJVar14->profileId = profileId;
      goto LAB_0049857d;
    }
    func = this->m_func;
    if (bVar3) {
      this_00 = (JitProfilingInstr *)
                IR::ProfiledInstr::New(newOpcode,&dstOpnd->super_Opnd,&pRVar12->super_Opnd,func);
      pPVar15 = IR::Instr::AsProfiledInstr((Instr *)this_00);
      (pPVar15->u).stElemInfo = (StElemInfo *)local_48;
      goto LAB_0049857d;
    }
  }
  else {
LAB_00498399:
    if ((0x3f < uVar2 - 0x117) ||
       ((0xe000000000000019U >> ((ulong)(uVar2 - 0x117) & 0x3f) & 1) == 0)) {
      if (uVar2 != 0x2b) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x16ad,"(false)","Unknown ElementI opcode");
        if (bVar3) {
          *puVar9 = 0;
          return;
        }
LAB_004985b7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
LAB_004983f5:
      pRVar12 = BuildDstOpnd(this,regSlot,TyVar,false,false);
      bVar3 = Func::DoSimpleJitDynamicProfile(this->m_func);
      if ((profileId == 0xffff) || (!bVar3)) {
        if (bVar6) {
          this_00 = (JitProfilingInstr *)
                    IR::ProfiledInstr::New
                              (newOpcode,&pRVar12->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
          pPVar15 = IR::Instr::AsProfiledInstr((Instr *)this_00);
          (pPVar15->u).ldElemInfo = (LdElemInfo *)local_50;
        }
        else {
          this_00 = (JitProfilingInstr *)
                    IR::Instr::New(newOpcode,&pRVar12->super_Opnd,&dstOpnd->super_Opnd,this->m_func)
          ;
        }
      }
      else {
        this_00 = IR::JitProfilingInstr::New
                            (newOpcode,&pRVar12->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
        pJVar14 = IR::Instr::AsJitProfilingInstr(&this_00->super_Instr);
        pJVar14->profileId = profileId;
      }
      goto LAB_0049857d;
    }
    pRVar12 = BuildSrcOpnd(this,regSlot,TyVar);
    func = this->m_func;
  }
  this_00 = (JitProfilingInstr *)
            IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&pRVar12->super_Opnd,func);
LAB_0049857d:
  AddInstr(this,&this_00->super_Instr,offset);
  if (((bVar4 & 1) != 0) && (bVar3 = DoBailOnNoProfile(this), bVar3)) {
    InsertBailOnNoProfile(this,&this_00->super_Instr);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementI(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, Js::RegSlot indexRegSlot,
                        Js::RegSlot regSlot, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    ValueType arrayType;
    const Js::LdElemInfo *ldElemInfo = nullptr;
    const Js::StElemInfo *stElemInfo = nullptr;
    bool isProfiledLoad = false;
    bool isProfiledStore = false;
    bool isProfiledInstr = (profileId != Js::Constants::NoProfileId);
    bool isLdElemOrStElemThatWasNotProfiled = false;

    if (isProfiledInstr)
    {
        switch (newOpcode)
        {
        case Js::OpCode::LdElemI_A:
            if (!DoLoadInstructionArrayProfileInfo())
            {
                break;
            }
            ldElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetLdElemInfo(profileId);
            arrayType = ldElemInfo->GetArrayType();
            isLdElemOrStElemThatWasNotProfiled = !ldElemInfo->WasProfiled();
            isProfiledLoad = true;
            break;

        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
            if (!DoLoadInstructionArrayProfileInfo())
            {
                break;
            }
            isProfiledStore = true;
            stElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetStElemInfo(profileId);
            arrayType = stElemInfo->GetArrayType();
            isLdElemOrStElemThatWasNotProfiled = !stElemInfo->WasProfiled();
            break;
        }
    }

    IR::Instr *     instr;
    IR::RegOpnd *   regOpnd;

    IR::IndirOpnd * indirOpnd;
    indirOpnd = this->BuildIndirOpnd(this->BuildSrcOpnd(baseRegSlot), this->BuildSrcOpnd(indexRegSlot));

    if (isProfiledLoad || isProfiledStore)
    {
        if(arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
        {
            arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);

            // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
            // ProfiledInstr.
            if(isProfiledLoad)
            {
                Js::LdElemInfo *const newLdElemInfo = JitAnew(m_func->m_alloc, Js::LdElemInfo, *ldElemInfo);
                newLdElemInfo->arrayType = arrayType;
                ldElemInfo = newLdElemInfo;
            }
            else
            {
                Js::StElemInfo *const newStElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo, *stElemInfo);
                newStElemInfo->arrayType = arrayType;
                stElemInfo = newStElemInfo;
            }
        }
        indirOpnd->GetBaseOpnd()->SetValueType(arrayType);

        if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
        {
            isProfiledLoad = false;
            isProfiledStore = false;
        }
    }

    switch (newOpcode)
    {
    case Js::OpCode::LdMethodElem:
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
    case Js::OpCode::TypeofElem:
        {
            // Evaluate to register

            regOpnd = this->BuildDstOpnd(regSlot);

            if (m_func->DoSimpleJitDynamicProfile() && isProfiledInstr)
            {
                instr = IR::JitProfilingInstr::New(newOpcode, regOpnd, indirOpnd, m_func);
                instr->AsJitProfilingInstr()->profileId = profileId;
            }
            else if (isProfiledLoad)
            {
                instr = IR::ProfiledInstr::New(newOpcode, regOpnd, indirOpnd, m_func);
                instr->AsProfiledInstr()->u.ldElemInfo = ldElemInfo;
            }
            else
            {
                instr = IR::Instr::New(newOpcode, regOpnd, indirOpnd, m_func);
            }
            break;
        }

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        {
            // Store

            regOpnd = this->BuildSrcOpnd(regSlot);

            if (m_func->DoSimpleJitDynamicProfile() && isProfiledInstr)
            {
                instr = IR::JitProfilingInstr::New(newOpcode, indirOpnd, regOpnd, m_func);
                instr->AsJitProfilingInstr()->profileId = profileId;
            }
            else if (isProfiledStore)
            {
                instr = IR::ProfiledInstr::New(newOpcode, indirOpnd, regOpnd, m_func);
                instr->AsProfiledInstr()->u.stElemInfo = stElemInfo;
            }
            else
            {
                instr = IR::Instr::New(newOpcode, indirOpnd, regOpnd, m_func);
            }
            break;
        }

    case Js::OpCode::InitSetElemI:
    case Js::OpCode::InitGetElemI:
    case Js::OpCode::InitComputedProperty:
    case Js::OpCode::InitClassMemberComputedName:
    case Js::OpCode::InitClassMemberGetComputedName:
    case Js::OpCode::InitClassMemberSetComputedName:
        {

            regOpnd = this->BuildSrcOpnd(regSlot);

            instr = IR::Instr::New(newOpcode, indirOpnd, regOpnd, m_func);
            break;
        }

    default:
        AssertMsg(false, "Unknown ElementI opcode");
        return;

    }

    this->AddInstr(instr, offset);

    if(isLdElemOrStElemThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}